

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstHoisting.cpp
# Opt level: O1

void __thiscall wasm::ConstHoisting::visitFunction(ConstHoisting *this,Function *curr)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  Function *pFVar3;
  bool bVar4;
  Block *pBVar5;
  ulong uVar6;
  ulong in_RDX;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  _List_node_base *p_Var7;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  Literal local_80;
  _List_node_base *local_68;
  Function *local_60;
  undefined1 auStack_58 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> prelude;
  Builder local_38;
  Builder builder;
  
  auStack_58 = (undefined1  [8])0x0;
  prelude.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  prelude.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68 = (_List_node_base *)&(this->uses).List;
  p_Var7 = (this->uses).List.
           super__List_base<std::pair<const_wasm::Literal,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>,_std::allocator<std::pair<const_wasm::Literal,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  local_60 = curr;
  if (p_Var7 != local_68) {
    do {
      p_Var1 = p_Var7[2]._M_prev;
      p_Var2 = p_Var7[3]._M_next;
      Literal::Literal(&local_80,(Literal *)(p_Var7 + 1));
      bVar4 = worthHoisting(this,&local_80,(Index)((ulong)((long)p_Var2 - (long)p_Var1) >> 3));
      Literal::~Literal(&local_80);
      in_RDX = extraout_RDX;
      if (bVar4) {
        local_38.wasm =
             (Module *)
             hoist(this,(vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)
                        &p_Var7[2]._M_prev);
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        emplace_back<wasm::Expression*>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_58,
                   (Expression **)&local_38);
        in_RDX = extraout_RDX_00;
      }
      p_Var7 = p_Var7->_M_next;
    } while (p_Var7 != local_68);
  }
  if (auStack_58 !=
      (undefined1  [8])
      prelude.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_38.wasm =
         (this->
         super_WalkerPass<wasm::PostWalker<wasm::ConstHoisting,_wasm::Visitor<wasm::ConstHoisting,_void>_>_>
         ).super_PostWalker<wasm::ConstHoisting,_wasm::Visitor<wasm::ConstHoisting,_void>_>.
         super_Walker<wasm::ConstHoisting,_wasm::Visitor<wasm::ConstHoisting,_void>_>.currModule;
    uVar6 = 0;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)in_RDX;
    pBVar5 = Builder::
             makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                       (&local_38,
                        (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                        auStack_58,type);
    pFVar3 = local_60;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar6;
    pBVar5 = Builder::makeSequence(&local_38,(Expression *)pBVar5,local_60->body,type_00);
    pFVar3->body = (Expression *)pBVar5;
  }
  if (auStack_58 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_58,
                    (long)prelude.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_58);
  }
  return;
}

Assistant:

void visitFunction(Function* curr) {
    std::vector<Expression*> prelude;
    for (auto& [value, vec] : uses) {
      auto num = vec.size();
      if (worthHoisting(value, num)) {
        prelude.push_back(hoist(vec));
      }
    }
    if (!prelude.empty()) {
      Builder builder(*getModule());
      // merge-blocks can optimize this into a single block later in most cases
      curr->body = builder.makeSequence(builder.makeBlock(prelude), curr->body);
    }
  }